

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O1

bool __thiscall test_case::eval_grad(test_case *this,ggml_backend_t backend,char *op_name)

{
  pointer *ppfVar1;
  pointer pfVar2;
  pointer pfVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ggml_cgraph *pgVar9;
  undefined4 extraout_var;
  int *piVar10;
  long lVar11;
  undefined4 extraout_var_00;
  int *piVar12;
  ggml_tensor *t;
  double dVar13;
  size_type __new_size;
  ggml_tensor *t_00;
  undefined8 uVar14;
  FILE *pFVar15;
  bool bVar16;
  size_type sVar17;
  char *__format;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar18;
  float extraout_XMM0_Da;
  float fVar19;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  ggml_context_ptr ctx;
  float fd;
  float fu;
  vector<float,_std::allocator<float>_> gn;
  float fdh;
  float fuh;
  float xid;
  float xidh;
  float xiuh;
  float xiu;
  ggml_backend_buffer_ptr buf;
  vector<float,_std::allocator<float>_> x0;
  vector<float,_std::allocator<float>_> expect;
  undefined4 uVar20;
  undefined4 uVar21;
  _Head_base<0UL,_ggml_context_*,_false> local_148;
  uint local_13c;
  double local_138;
  ggml_backend_t local_130;
  vector<float,_std::allocator<float>_> local_128;
  float local_100;
  float local_fc;
  vector<float,_std::allocator<float>_> local_f8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  char *local_b8;
  unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> local_b0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  double local_78;
  size_type local_70;
  long local_68;
  undefined8 uStack_60;
  undefined1 local_58;
  undefined7 uStack_57;
  long *local_50 [2];
  long local_40 [2];
  
  this->mode = MODE_GRAD;
  (*this->_vptr_test_case[10])(&local_90,this);
  lVar7 = ggml_tensor_overhead();
  lVar8 = ggml_graph_overhead_custom(0x800,1);
  local_68 = lVar7 * 0x80 + lVar8 * 2;
  uStack_60 = 0;
  local_58 = 1;
  uVar14 = CONCAT71(uStack_57,1);
  uStack_60._0_4_ = 0;
  uVar20 = (undefined4)local_68;
  uVar21 = (undefined4)uStack_60;
  local_148._M_head_impl = (ggml_context *)ggml_init();
  if (local_148._M_head_impl == (ggml_context *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
               ,0x2f7,"GGML_ASSERT(%s) failed","ctx",in_R8,in_R9,uVar20,uVar21,uVar14);
  }
  pgVar9 = (ggml_cgraph *)ggml_new_graph_custom(local_148._M_head_impl,0x800,1);
  this->gf = pgVar9;
  pgVar9 = (ggml_cgraph *)ggml_new_graph_custom(local_148._M_head_impl,0x800,1);
  this->gb = pgVar9;
  iVar5 = (*this->_vptr_test_case[4])(this,local_148._M_head_impl);
  piVar12 = (int *)CONCAT44(extraout_var,iVar5);
  if (op_name == (char *)0x0) {
LAB_0011abec:
    bVar18 = piVar12[0x14] == 0x51;
    bVar16 = op_name != (char *)0x0;
  }
  else {
    (*this->_vptr_test_case[2])(local_50,this,piVar12);
    iVar5 = std::__cxx11::string::compare((char *)local_50);
    bVar18 = true;
    bVar16 = true;
    if (iVar5 == 0) goto LAB_0011abec;
  }
  if ((bVar16) && (local_50[0] != local_40)) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  bVar16 = true;
  if (bVar18) goto LAB_0011ade7;
  (*this->_vptr_test_case[2])(&local_128,this,piVar12);
  pfVar2 = local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*this->_vptr_test_case[3])(&local_f8,this);
  printf("  %s(%s): ",pfVar2,
         local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start);
  if ((pointer *)
      local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  ppfVar1 = &local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  if ((pointer *)
      local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != ppfVar1) {
    operator_delete(local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  fflush(_stdout);
  if (*piVar12 != 0) {
    printf("not supported [%s->type != FP32]\n",piVar12 + 0x40);
LAB_0011acca:
    bVar16 = true;
    goto LAB_0011ade7;
  }
  piVar10 = (int *)ggml_get_first_tensor(local_148._M_head_impl);
  bVar18 = false;
  for (; piVar10 != (int *)0x0;
      piVar10 = (int *)ggml_get_next_tensor(local_148._M_head_impl,piVar10)) {
    cVar4 = ggml_backend_supports_op(backend,piVar10);
    if (cVar4 == '\0') {
      uVar14 = ggml_backend_name(backend);
      printf("not supported [%s] ",uVar14);
      break;
    }
    if (((*(byte *)(piVar10 + 0x25) & 4) != 0) && (bVar18 = true, *piVar10 != 0)) {
      printf("not supported [%s->type != FP32] ",piVar10 + 0x40);
      bVar18 = true;
      break;
    }
  }
  if (bVar18) {
    if (piVar10 == (int *)0x0) {
      lVar7 = ggml_get_first_tensor(local_148._M_head_impl);
      lVar8 = 0;
      for (; lVar7 != 0; lVar7 = ggml_get_next_tensor(local_148._M_head_impl,lVar7)) {
        if ((*(byte *)(lVar7 + 0x94) & 4) != 0) {
          lVar11 = ggml_nelements(lVar7);
          lVar8 = lVar8 + lVar11;
        }
      }
      iVar5 = (*this->_vptr_test_case[9])(this);
      if (CONCAT44(extraout_var_00,iVar5) < lVar8) {
        puts("skipping large tensors for speed ");
        goto LAB_0011acca;
      }
      cVar4 = ggml_is_scalar(piVar12);
      if (cVar4 == '\0') {
        piVar12 = (int *)ggml_sum(local_148._M_head_impl,piVar12);
        ggml_set_name(piVar12,"sum_of_out");
      }
      ggml_set_loss(piVar12);
      ggml_build_forward_expand(this->gf,piVar12);
      ggml_graph_cpy(this->gf,this->gb);
      ggml_build_backward_expand(local_148._M_head_impl,local_148._M_head_impl,this->gb,0);
      if ((((long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != 4) ||
          (*local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != 0.0)) ||
         (NAN(*local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start))) {
        iVar5 = ggml_graph_n_nodes(this->gb);
        iVar6 = ggml_graph_n_nodes(this->gf);
        if (iVar5 <= iVar6) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                     ,0x33c,"GGML_ASSERT(%s) failed",
                     "ggml_graph_n_nodes(gb) > ggml_graph_n_nodes(gf)");
        }
        for (lVar7 = ggml_get_first_tensor(local_148._M_head_impl); lVar7 != 0;
            lVar7 = ggml_get_next_tensor(local_148._M_head_impl,lVar7)) {
          if (((*(byte *)(lVar7 + 0x94) & 4) != 0) &&
             (lVar8 = ggml_graph_get_grad(this->gb,lVar7), *(int *)(lVar8 + 0x50) == 0)) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                       ,0x33e,"GGML_ASSERT(%s) failed",
                       "!(t->flags & GGML_TENSOR_FLAG_PARAM) || ggml_graph_get_grad(gb, t)->op != GGML_OP_NONE"
                      );
          }
        }
      }
      for (piVar10 = (int *)ggml_get_first_tensor(local_148._M_head_impl); piVar10 != (int *)0x0;
          piVar10 = (int *)ggml_get_next_tensor(local_148._M_head_impl,piVar10)) {
        cVar4 = ggml_backend_supports_op(backend,piVar10);
        if (cVar4 == '\0') {
          piVar10 = (int *)ggml_backend_name(backend);
          __format = "not supported [%s] ";
LAB_0011b5ce:
          printf(__format,piVar10);
          goto LAB_0011addd;
        }
        if (((*(byte *)(piVar10 + 0x25) & 4) != 0) && (*piVar10 != 0)) {
          piVar10 = piVar10 + 0x40;
          __format = "not supported [%s->type != FP32] ";
          goto LAB_0011b5ce;
        }
      }
      local_b0._M_t.super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t.
      super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
      super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl =
           (__uniq_ptr_data<ggml_backend_buffer,_ggml_backend_buffer_deleter,_true,_true>)
           ggml_backend_alloc_ctx_tensors(local_148._M_head_impl,backend);
      if ((tuple<ggml_backend_buffer_*,_ggml_backend_buffer_deleter>)
          local_b0._M_t.super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>._M_t
          .super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>.
          super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl ==
          (_Head_base<0UL,_ggml_backend_buffer_*,_false>)0x0) {
        uVar14 = ggml_backend_name(backend);
        bVar16 = false;
        printf("failed to allocate tensors [%s] ",uVar14);
      }
      else {
        (*this->_vptr_test_case[0xb])(this,local_148._M_head_impl);
        ggml_graph_reset(this->gb);
        iVar5 = ggml_backend_graph_compute(backend,this->gf);
        pFVar15 = _stderr;
        if (iVar5 == 0) {
          iVar5 = ggml_backend_graph_compute(backend,this->gb);
          pFVar15 = _stderr;
          if (iVar5 == 0) {
            t = (ggml_tensor *)ggml_get_first_tensor(local_148._M_head_impl);
            local_13c = (uint)CONCAT71((int7)((ulong)t >> 8),1);
            local_b8 = "ggml_is_scalar(out)";
            local_130 = backend;
            for (; t != (ggml_tensor *)0x0;
                t = (ggml_tensor *)ggml_get_next_tensor(local_148._M_head_impl,t)) {
              if ((t->flags & 4) != 0) {
                dVar13 = (double)ggml_backend_name(backend);
                __new_size = ggml_nelements(t);
                local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start = (float *)0x0;
                local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                t_00 = (ggml_tensor *)ggml_graph_get_grad(this->gb,t);
                if (t_00 == (ggml_tensor *)0x0) {
                  std::vector<float,_std::allocator<float>_>::resize(&local_128,__new_size);
                }
                else {
                  tensor_to_float(&local_f8,t_00);
                  pfVar3 = local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
                  pfVar2 = local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start = (float *)0x0;
                  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if (pfVar2 != (float *)0x0) {
                    operator_delete(pfVar2,(long)pfVar3 - (long)pfVar2);
                  }
                  if (local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start != (float *)0x0) {
                    operator_delete(local_f8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_f8.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_f8.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                if (0 < (long)__new_size) {
                  sVar17 = 0;
                  do {
                    local_138 = dVar13;
                    if (0x7f7fffff <
                        (uint)ABS(local_128.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start[sVar17])) {
                      uVar14 = ggml_op_desc(t);
                      printf("[%s] nonfinite gradient at index %ld (%s=%f) ",
                             SUB84((double)local_128.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start[sVar17],0),uVar14,
                             sVar17,local_138);
                      local_13c = 0;
                      break;
                    }
                    sVar17 = sVar17 + 1;
                  } while (__new_size != sVar17);
                }
                iVar5 = 0xe;
                if ((local_13c & 1) != 0) {
                  std::vector<float,_std::allocator<float>_>::vector
                            (&local_f8,__new_size,(allocator_type *)&local_a8);
                  if ((long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start !=
                      (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start) {
                    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                               ,0x386,"GGML_ASSERT(%s) failed","ga.size() == gn.size()");
                  }
                  tensor_to_float(&local_a8,t);
                  cVar4 = ggml_is_scalar(piVar12);
                  if (cVar4 == '\0') {
                    uVar14 = 0x389;
LAB_0011b70f:
                    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                               ,uVar14,"GGML_ASSERT(%s) failed",local_b8);
                  }
                  if (*piVar12 != 0) {
                    uVar14 = 0x38a;
                    local_b8 = "out->type == GGML_TYPE_F32";
                    goto LAB_0011b70f;
                  }
                  (*this->_vptr_test_case[7])(this);
                  local_138 = (double)CONCAT44(local_138._4_4_,extraout_XMM0_Da);
                  iVar5 = 0x14;
                  bVar18 = 0 < (long)__new_size;
                  if (0 < (long)__new_size) {
                    local_d4 = extraout_XMM0_Da + extraout_XMM0_Da;
                    local_78 = (double)extraout_XMM0_Da * 6.0;
                    sVar17 = 0;
                    local_70 = __new_size;
                    do {
                      local_bc = local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[sVar17] + local_138._0_4_;
                      local_c0 = local_138._0_4_ * 0.5 +
                                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[sVar17];
                      local_c4 = local_138._0_4_ * -0.5 +
                                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[sVar17];
                      local_c8 = local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[sVar17] - local_138._0_4_;
                      lVar7 = sVar17 * 4;
                      ggml_backend_tensor_set(t,&local_bc,lVar7,4);
                      iVar5 = ggml_backend_graph_compute(local_130,this->gf);
                      pFVar15 = _stderr;
                      if (iVar5 != 0) {
                        uVar14 = ggml_status_to_string(iVar5);
LAB_0011b584:
                        fprintf(pFVar15,"%s: ggml_backend_graph_compute failed. status=%s \n",
                                "eval_grad",uVar14);
                        iVar5 = 1;
                        goto LAB_0011b43f;
                      }
                      uVar14 = ggml_nbytes(piVar12);
                      ggml_backend_tensor_get(piVar12,&local_fc,0,uVar14);
                      ggml_backend_tensor_set(t,&local_c8,lVar7,4);
                      iVar5 = ggml_backend_graph_compute(local_130,this->gf);
                      pFVar15 = _stderr;
                      if (iVar5 != 0) {
                        uVar14 = ggml_status_to_string(iVar5);
                        goto LAB_0011b584;
                      }
                      uVar14 = ggml_nbytes(piVar12);
                      ggml_backend_tensor_get(piVar12,&local_100,0,uVar14);
                      iVar5 = (*this->_vptr_test_case[8])(this);
                      if ((char)iVar5 != '\0') {
                        ggml_backend_tensor_set(t,&local_c0,lVar7,4);
                        iVar5 = ggml_backend_graph_compute(local_130,this->gf);
                        pFVar15 = _stderr;
                        if (iVar5 == 0) {
                          uVar14 = ggml_nbytes(piVar12);
                          ggml_backend_tensor_get(piVar12,&local_cc,0,uVar14);
                          ggml_backend_tensor_set(t,&local_c4,lVar7,4);
                          iVar5 = ggml_backend_graph_compute(local_130,this->gf);
                          pFVar15 = _stderr;
                          if (iVar5 == 0) {
                            uVar14 = ggml_nbytes(piVar12);
                            ggml_backend_tensor_get(piVar12,&local_d0,0,uVar14);
                            fVar19 = (float)((((double)local_cc * 8.0 + (double)local_100) -
                                             ((double)local_d0 * 8.0 + (double)local_fc)) / local_78
                                            );
                            goto LAB_0011b3fb;
                          }
                          uVar14 = ggml_status_to_string(iVar5);
                        }
                        else {
                          uVar14 = ggml_status_to_string(iVar5);
                        }
                        goto LAB_0011b584;
                      }
                      fVar19 = (local_fc - local_100) / local_d4;
LAB_0011b3fb:
                      pfVar2 = local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[sVar17] = fVar19;
                      uVar14 = ggml_nbytes(t);
                      ggml_backend_tensor_set(t,pfVar2,0,uVar14);
                      sVar17 = sVar17 + 1;
                      bVar18 = (long)sVar17 < (long)local_70;
                    } while (sVar17 != local_70);
                    iVar5 = 0x14;
                  }
LAB_0011b43f:
                  backend = local_130;
                  if (!bVar18) {
                    local_138 = mean_abs_asymm(local_f8.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_start,
                                               local_128.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_start,
                                               (long)local_f8.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                               (long)local_f8.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 2,
                                               &local_90);
                    (*this->_vptr_test_case[6])(this);
                    backend = local_130;
                    iVar5 = 0;
                    if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da_00) <= local_138 &&
                        local_138 != (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da_00)) {
                      uVar14 = ggml_op_desc(t);
                      (*this->_vptr_test_case[6])(this);
                      printf("[%s] MAA = %.9f > %.9f ",SUB84(local_138,0),
                             CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_01),uVar14);
                      iVar5 = 0xe;
                      local_13c = 0;
                    }
                  }
                  if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_a8.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_a8.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start != (float *)0x0) {
                    operator_delete(local_f8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_f8.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_f8.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != (float *)0x0) {
                  operator_delete(local_128.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                if (iVar5 != 0) goto LAB_0011b5ff;
              }
            }
            iVar5 = 0xe;
LAB_0011b5ff:
            if (iVar5 == 0xe) {
              if ((local_13c & 1) == 0) {
                bVar16 = false;
                printf("compare failed ");
                puts("\x1b[1;31mFAIL\x1b[0m");
              }
              else {
                puts("\x1b[1;32mOK\x1b[0m");
                bVar16 = true;
              }
            }
            else {
              bVar16 = false;
            }
            goto LAB_0011b67f;
          }
          uVar14 = ggml_status_to_string(iVar5);
        }
        else {
          uVar14 = ggml_status_to_string(iVar5);
        }
        bVar16 = false;
        fprintf(pFVar15,"%s: ggml_backend_graph_compute failed. status=%s \n","eval_grad",uVar14);
      }
LAB_0011b67f:
      std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr(&local_b0);
      goto LAB_0011ade7;
    }
  }
  else {
    (*this->_vptr_test_case[2])(&local_128,this,piVar12);
    printf("not supported [%s] \n",
           local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start);
    if ((pointer *)
        local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != ppfVar1) {
      operator_delete(local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
  }
LAB_0011addd:
  bVar16 = true;
  putchar(10);
LAB_0011ade7:
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)&local_148);
  if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar16;
}

Assistant:

bool eval_grad(ggml_backend_t backend, const char * op_name) {
        mode = MODE_GRAD;
        const std::vector<float> expect = grad_expect();

        ggml_init_params params = {
            /* .mem_size = */ ggml_tensor_overhead()*128 + 2*ggml_graph_overhead_custom(GGML_DEFAULT_GRAPH_SIZE, true),
            /* .mem_base = */ NULL,
            /* .no_alloc = */ true,
        };
        ggml_context_ptr ctx(ggml_init(params)); // smart ptr
        GGML_ASSERT(ctx);

        gf = ggml_new_graph_custom(ctx.get(), GGML_DEFAULT_GRAPH_SIZE, true);
        gb = ggml_new_graph_custom(ctx.get(), GGML_DEFAULT_GRAPH_SIZE, true);

        ggml_tensor * out = build_graph(ctx.get());

        if ((op_name != nullptr && op_desc(out) != op_name) || out->op == GGML_OP_OPT_STEP_ADAMW) {
            //printf("  %s: skipping\n", op_desc(out).c_str());
            return true;
        }

        printf("  %s(%s): ", op_desc(out).c_str(), vars().c_str());
        fflush(stdout);

        if (out->type != GGML_TYPE_F32) {
            printf("not supported [%s->type != FP32]\n", out->name);
            return true;
        }

        // check if the backend supports the ops
        bool supported = true;
        bool any_params = false;
        for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (!ggml_backend_supports_op(backend, t)) {
                printf("not supported [%s] ", ggml_backend_name(backend));
                supported = false;
                break;
            }
            if ((t->flags & GGML_TENSOR_FLAG_PARAM)) {
                any_params = true;
                if (t->type != GGML_TYPE_F32) {
                    printf("not supported [%s->type != FP32] ", t->name);
                    supported = false;
                    break;
                }
            }
        }
        if (!any_params) {
            printf("not supported [%s] \n", op_desc(out).c_str());
            supported = false;
        }
        if (!supported) {
            printf("\n");
            return true;
        }

        int64_t ngrads = 0;
        for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (t->flags & GGML_TENSOR_FLAG_PARAM) {
                ngrads += ggml_nelements(t);
            }
        }
        if (ngrads > grad_nmax()) {
            printf("skipping large tensors for speed \n");
            return true;
        }


        if (!ggml_is_scalar(out)) {
            out = ggml_sum(ctx.get(), out);
            ggml_set_name(out, "sum_of_out");
        }
        ggml_set_loss(out);

        ggml_build_forward_expand(gf, out);
        ggml_graph_cpy(gf, gb);
        ggml_build_backward_expand(ctx.get(), ctx.get(), gb, false);
        if (expect.size() != 1 || expect[0] != 0.0f) {
            GGML_ASSERT(ggml_graph_n_nodes(gb) > ggml_graph_n_nodes(gf));
            for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
                GGML_ASSERT(!(t->flags & GGML_TENSOR_FLAG_PARAM) || ggml_graph_get_grad(gb, t)->op != GGML_OP_NONE);
            }
        }

        for (ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != NULL; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (!ggml_backend_supports_op(backend, t)) {
                printf("not supported [%s] ", ggml_backend_name(backend));
                supported = false;
                break;
            }
            if ((t->flags & GGML_TENSOR_FLAG_PARAM) && t->type != GGML_TYPE_F32) {
                printf("not supported [%s->type != FP32] ", t->name);
                supported = false;
                break;
            }
        }
        if (!supported) {
            printf("\n");
            return true;
        }

        // allocate
        ggml_backend_buffer_ptr buf(ggml_backend_alloc_ctx_tensors(ctx.get(), backend)); // smart ptr
        if (buf == NULL) {
            printf("failed to allocate tensors [%s] ", ggml_backend_name(backend));
            return false;
        }

        initialize_tensors(ctx.get()); // Randomizes all tensors (including gradients).
        ggml_graph_reset(gb);    // Sets gradients to 1 if loss, 0 otherwise.

        ggml_status status = ggml_backend_graph_compute(backend, gf);
        if (status != GGML_STATUS_SUCCESS) {
            fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
            return false;
        }
        status = ggml_backend_graph_compute(backend, gb);
        if (status != GGML_STATUS_SUCCESS) {
            fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
            return false;
        }

        bool ok = true;
        for (struct ggml_tensor * t = ggml_get_first_tensor(ctx.get()); t != nullptr; t = ggml_get_next_tensor(ctx.get(), t)) {
            if (!(t->flags & GGML_TENSOR_FLAG_PARAM)) {
                continue;
            }

            const char * bn = ggml_backend_name(backend);
            const int64_t ne = ggml_nelements(t);

            std::vector<float> ga;
            struct ggml_tensor * grad = ggml_graph_get_grad(gb, t);
            if (grad) {
                ga = tensor_to_float(grad);
            } else {
                ga.resize(ne); // default value is 0.0f
            }

            for (int64_t i = 0; i < ne; ++i) { // gradient algebraic
                // check for nans
                if (!std::isfinite(ga[i])) {
                    printf("[%s] nonfinite gradient at index %" PRId64 " (%s=%f) ", ggml_op_desc(t), i, bn, ga[i]);
                    ok = false;
                    break;
                }
            }
            if (!ok) {
                break;
            }

            std::vector<float> gn(ne); // gradient numeric
            GGML_ASSERT(ga.size() == gn.size());

            std::vector<float> x0 = tensor_to_float(t); // original t data
            GGML_ASSERT(ggml_is_scalar(out));
            GGML_ASSERT(out->type == GGML_TYPE_F32);

            const float eps = grad_eps();
            for (int64_t i = 0; i < ne; ++i) {
                const float xiu  = x0[i] + 1.0f*eps; // x, index i, up
                const float xiuh = x0[i] + 0.5f*eps; // x, index i, up half
                const float xidh = x0[i] - 0.5f*eps; // x, index i, down half
                const float xid  = x0[i] - 1.0f*eps; // x, index i, down

                float fu, fuh, fdh, fd; // output values for xiu, xiuh, xid, xidh

                ggml_backend_tensor_set(t, &xiu, i*sizeof(float), sizeof(float));
                status = ggml_backend_graph_compute(backend, gf);
                if (status != GGML_STATUS_SUCCESS) {
                    fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                    return false;
                }
                ggml_backend_tensor_get(out, &fu, 0, ggml_nbytes(out));

                ggml_backend_tensor_set(t, &xid, i*sizeof(float), sizeof(float));
                status = ggml_backend_graph_compute(backend, gf);
                if (status != GGML_STATUS_SUCCESS) {
                    fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                    return false;
                }
                ggml_backend_tensor_get(out, &fd, 0, ggml_nbytes(out));

                if (grad_precise()) {
                    ggml_backend_tensor_set(t, &xiuh, i*sizeof(float), sizeof(float));
                    status = ggml_backend_graph_compute(backend, gf);
                    if (status != GGML_STATUS_SUCCESS) {
                        fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                        return false;
                    }
                    ggml_backend_tensor_get(out, &fuh, 0, ggml_nbytes(out));

                    ggml_backend_tensor_set(t, &xidh, i*sizeof(float), sizeof(float));
                    status = ggml_backend_graph_compute(backend, gf);
                    if (status != GGML_STATUS_SUCCESS) {
                        fprintf(stderr, "%s: ggml_backend_graph_compute failed. status=%s \n", __func__, ggml_status_to_string(status));
                        return false;
                    }
                    ggml_backend_tensor_get(out, &fdh, 0, ggml_nbytes(out));

                    gn[i] = (8.0*(double)fuh + (double)fd - (8.0*(double)fdh + (double)fu)) / (6.0*(double)eps);
                } else {
                    gn[i] = (fu - fd) / (2.0f*eps);
                }

                ggml_backend_tensor_set(t, x0.data(), 0, ggml_nbytes(t));
            }

            const double err = mean_abs_asymm(gn.data(), ga.data(), gn.size(), expect);
            if (err > max_maa_err()) {
                printf("[%s] MAA = %.9f > %.9f ", ggml_op_desc(t), err, max_maa_err());
                ok = false;
                break;
            }
            if (!ok) {
                break;
            }
        }

        if (!ok) {
            printf("compare failed ");
        }

        if (ok) {
            printf("\033[1;32mOK\033[0m\n");
            return true;
        }

        printf("\033[1;31mFAIL\033[0m\n");
        return false;
    }